

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

int av1_check_show_filtered_frame
              (YV12_BUFFER_CONFIG *frame,FRAME_DIFF *frame_diff,int q_index,
              aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  long *in_RSI;
  long in_RDI;
  float fVar4;
  double dVar5;
  float threshold;
  int ac_q_step;
  float std;
  float mean;
  int num_mbs;
  int mb_cols;
  int mb_rows;
  int block_width;
  int block_height;
  int frame_width;
  int frame_height;
  aom_bit_depth_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_4;
  
  iVar3 = *(int *)(in_RDI + 0x10);
  iVar2 = get_num_blocks(*(int *)(in_RDI + 0x18),0x20);
  iVar3 = get_num_blocks(iVar3,0x20);
  if (iVar2 * iVar3 < 1) {
    iVar2 = 1;
  }
  else {
    iVar2 = iVar2 * iVar3;
  }
  fVar4 = (float)*in_RSI / (float)iVar2;
  dVar5 = sqrt((double)(-fVar4 * fVar4 + (float)in_RSI[1] / (float)iVar2));
  iVar1 = av1_ac_quant_QTX(iVar2,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if (((float)(int)iVar1 * 0.7 * (float)(int)iVar1 <= fVar4) || (fVar4 * 1.2 <= (float)dVar5)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int av1_check_show_filtered_frame(const YV12_BUFFER_CONFIG *frame,
                                  const FRAME_DIFF *frame_diff, int q_index,
                                  aom_bit_depth_t bit_depth) {
  const int frame_height = frame->y_crop_height;
  const int frame_width = frame->y_crop_width;
  const int block_height = block_size_high[TF_BLOCK_SIZE];
  const int block_width = block_size_wide[TF_BLOCK_SIZE];
  const int mb_rows = get_num_blocks(frame_height, block_height);
  const int mb_cols = get_num_blocks(frame_width, block_width);
  const int num_mbs = AOMMAX(1, mb_rows * mb_cols);
  const float mean = (float)frame_diff->sum / num_mbs;
  const float std = (float)sqrt((float)frame_diff->sse / num_mbs - mean * mean);

  const int ac_q_step = av1_ac_quant_QTX(q_index, 0, bit_depth);
  const float threshold = 0.7f * ac_q_step * ac_q_step;

  if (mean < threshold && std < mean * 1.2) {
    return 1;
  }
  return 0;
}